

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

FT_Error FT_Stream_OpenGzip(FT_Stream stream,FT_Stream source)

{
  FT_Memory memory_00;
  FT_GZipFile zip_00;
  FT_ULong count_00;
  FT_Byte *buffer;
  FT_ULong FVar1;
  FT_ULong count;
  FT_Byte *zip_buff;
  FT_ULong zip_size;
  FT_GZipFile zip;
  FT_Memory memory;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream source_local;
  FT_Stream stream_local;
  
  if ((stream == (FT_Stream)0x0) || (source == (FT_Stream)0x0)) {
    memory._4_4_ = 0x28;
  }
  else {
    memory_00 = source->memory;
    pFStack_18 = source;
    source_local = stream;
    memory._4_4_ = ft_gzip_check_header(source);
    if (memory._4_4_ == 0) {
      memset(source_local,0,0x50);
      source_local->memory = memory_00;
      zip_00 = (FT_GZipFile)ft_mem_qalloc(memory_00,0x20a8,(FT_Error *)((long)&memory + 4));
      if (memory._4_4_ == 0) {
        memory._4_4_ = ft_gzip_file_init(zip_00,source_local,pFStack_18);
        if (memory._4_4_ != 0) {
          ft_mem_free(memory_00,zip_00);
          return memory._4_4_;
        }
        (source_local->descriptor).pointer = zip_00;
        memory._4_4_ = 0;
      }
      count_00 = ft_gzip_get_uncompressed_size(pFStack_18);
      if ((count_00 != 0) && (count_00 < 0xa000)) {
        buffer = (FT_Byte *)ft_mem_alloc(memory_00,count_00,(FT_Error *)((long)&memory + 4));
        if (memory._4_4_ == 0) {
          FVar1 = ft_gzip_file_io(zip_00,0,buffer,count_00);
          if (FVar1 == count_00) {
            ft_gzip_file_done(zip_00);
            ft_mem_free(memory_00,zip_00);
            (source_local->descriptor).value = 0;
            source_local->size = count_00;
            source_local->pos = 0;
            source_local->base = buffer;
            source_local->read = (FT_Stream_IoFunc)0x0;
            source_local->close = ft_gzip_stream_close;
            return memory._4_4_;
          }
          ft_gzip_file_io(zip_00,0,(FT_Byte *)0x0,0);
          ft_mem_free(memory_00,buffer);
        }
        memory._4_4_ = 0;
      }
      if (count_00 == 0) {
        source_local->size = 0x7fffffff;
      }
      else {
        source_local->size = count_00;
      }
      source_local->pos = 0;
      source_local->base = (uchar *)0x0;
      source_local->read = ft_gzip_stream_io;
      source_local->close = ft_gzip_stream_close;
    }
  }
  return memory._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stream_OpenGzip( FT_Stream  stream,
                      FT_Stream  source )
  {
    FT_Error     error;
    FT_Memory    memory;
    FT_GZipFile  zip = NULL;


    if ( !stream || !source )
    {
      error = FT_THROW( Invalid_Stream_Handle );
      goto Exit;
    }

    memory = source->memory;

    /*
     *  check the header right now; this prevents allocating un-necessary
     *  objects when we don't need them
     */
    error = ft_gzip_check_header( source );
    if ( error )
      goto Exit;

    FT_ZERO( stream );
    stream->memory = memory;

    if ( !FT_QNEW( zip ) )
    {
      error = ft_gzip_file_init( zip, stream, source );
      if ( error )
      {
        FT_FREE( zip );
        goto Exit;
      }

      stream->descriptor.pointer = zip;
    }

    /*
     *  We use the following trick to try to dramatically improve the
     *  performance while dealing with small files.  If the original stream
     *  size is less than a certain threshold, we try to load the whole font
     *  file into memory.  This saves us from using the 32KB buffer needed
     *  to inflate the file, plus the two 4KB intermediate input/output
     *  buffers used in the `FT_GZipFile' structure.
     */
    {
      FT_ULong  zip_size = ft_gzip_get_uncompressed_size( source );


      if ( zip_size != 0 && zip_size < 40 * 1024 )
      {
        FT_Byte*  zip_buff = NULL;


        if ( !FT_ALLOC( zip_buff, zip_size ) )
        {
          FT_ULong  count;


          count = ft_gzip_file_io( zip, 0, zip_buff, zip_size );
          if ( count == zip_size )
          {
            ft_gzip_file_done( zip );
            FT_FREE( zip );

            stream->descriptor.pointer = NULL;

            stream->size  = zip_size;
            stream->pos   = 0;
            stream->base  = zip_buff;
            stream->read  = NULL;
            stream->close = ft_gzip_stream_close;

            goto Exit;
          }

          ft_gzip_file_io( zip, 0, NULL, 0 );
          FT_FREE( zip_buff );
        }
        error = FT_Err_Ok;
      }

      if ( zip_size )
        stream->size = zip_size;
      else
        stream->size  = 0x7FFFFFFFL;  /* don't know the real size! */
    }

    stream->pos   = 0;
    stream->base  = NULL;
    stream->read  = ft_gzip_stream_io;
    stream->close = ft_gzip_stream_close;

  Exit:
    return error;
  }